

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowViewportThumbnails(void)

{
  undefined8 *puVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiViewportP *pIVar4;
  ImDrawList *pIVar5;
  ImFont *font;
  char *text_begin;
  undefined1 auVar6 [16];
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  ImGuiContext *pIVar18;
  ImGuiWindow *pIVar19;
  ImU32 IVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  char *text_end;
  ImGuiWindow *this;
  uint uVar24;
  undefined4 uVar25;
  float fVar26;
  float fVar27;
  undefined4 uVar28;
  float fVar29;
  float fVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  float fVar33;
  float fVar34;
  float fVar36;
  undefined1 auVar35 [16];
  float fVar37;
  float fVar38;
  float fVar40;
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  ImRect thumb_r_scaled;
  ImVec4 local_138;
  ImVec2 local_128;
  ImVec2 IStack_120;
  ImVec2 local_118;
  ImVec2 IStack_110;
  ImVec2 local_108;
  ImVec2 local_100;
  undefined1 local_f8 [16];
  ImGuiWindow *local_e0;
  ImVec2 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  ImGuiWindow *local_a0;
  ImGuiContext *local_98;
  ImDrawList *local_90;
  long local_88;
  ImGuiViewportP *local_80;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  lVar21 = (long)(GImGui->Viewports).Size;
  if (lVar21 < 1) {
    local_68 = ZEXT816(0);
    _local_78 = ZEXT816(0);
  }
  else {
    uVar25 = 0;
    uVar28 = 0;
    uVar31 = 0;
    uVar32 = 0;
    lVar22 = 0;
    _local_78 = ZEXT816(0);
    do {
      pIVar4 = (GImGui->Viewports).Data[lVar22];
      IVar2 = (pIVar4->super_ImGuiViewport).Pos;
      auVar41._8_8_ = 0;
      auVar41._0_4_ = IVar2.x;
      auVar41._4_4_ = IVar2.y;
      IVar3 = (pIVar4->super_ImGuiViewport).Size;
      auVar39._0_4_ = IVar3.x + IVar2.x;
      auVar39._4_4_ = IVar3.y + IVar2.y;
      auVar39._8_8_ = 0;
      auVar6._4_4_ = uVar28;
      auVar6._0_4_ = uVar25;
      auVar6._8_4_ = uVar31;
      auVar6._12_4_ = uVar32;
      local_68 = maxps(auVar39,auVar6);
      _local_78 = minps(auVar41,_local_78);
      lVar22 = lVar22 + 1;
      uVar25 = local_68._0_4_;
      uVar28 = local_68._4_4_;
      uVar31 = local_68._8_4_;
      uVar32 = local_68._12_4_;
    } while (lVar21 != lVar22);
  }
  if (0 < (GImGui->Viewports).Size) {
    local_a0 = GImGui->CurrentWindow;
    IVar2 = (local_a0->DC).CursorPos;
    local_58 = (float)local_78._0_4_ * -0.125 + IVar2.x;
    fStack_54 = (float)local_78._4_4_ * -0.125 + IVar2.y;
    fStack_50 = fStack_70 * 0.0 + 0.0;
    fStack_4c = fStack_6c * 0.0 + 0.0;
    lVar21 = 0;
    local_98 = GImGui;
    do {
      pIVar18 = GImGui;
      local_80 = (local_98->Viewports).Data[lVar21];
      IVar2 = (local_80->super_ImGuiViewport).Pos;
      fVar26 = IVar2.x;
      fVar29 = IVar2.y;
      local_108.x = fVar26 * 0.125 + local_58;
      local_108.y = fVar29 * 0.125 + fStack_54;
      fStack_b0 = fStack_50 + 0.0;
      fStack_ac = fStack_4c + 0.0;
      local_90 = local_a0->DrawList;
      local_e0 = GImGui->CurrentWindow;
      IVar2 = (local_80->super_ImGuiViewport).Size;
      local_f8._8_8_ = 0;
      local_f8._0_4_ = IVar2.x;
      local_f8._4_4_ = IVar2.y;
      local_100.x = (IVar2.x + fVar26) * 0.125 + local_58;
      local_100.y = ((local_80->super_ImGuiViewport).Size.y + fVar29) * 0.125 + fStack_54;
      local_c8._4_4_ = local_100.y;
      local_c8._0_4_ = local_100.x;
      fStack_c0 = fStack_50 + 0.0;
      fStack_bc = fStack_4c + 0.0;
      local_d8 = (local_80->super_ImGuiViewport).Pos;
      uStack_d0 = 0;
      fVar26 = *(float *)(&DAT_0021eda0 +
                         (ulong)(-1 < (char)(local_80->super_ImGuiViewport).Flags) * 4);
      pIVar5 = local_e0->DrawList;
      local_138.x = (GImGui->Style).Colors[5].x;
      local_138.y = (GImGui->Style).Colors[5].y;
      uVar7 = (GImGui->Style).Colors[5].z;
      uVar8 = (GImGui->Style).Colors[5].w;
      local_138.w = fVar26 * 0.4 * (GImGui->Style).Alpha * (float)uVar8;
      local_138.z = (float)uVar7;
      local_b8 = local_108.x;
      fStack_b4 = local_108.y;
      local_88 = lVar21;
      IVar20 = ColorConvertFloat4ToU32(&local_138);
      ImDrawList::AddRectFilled(pIVar5,&local_108,&local_100,IVar20,0.0,0xf);
      if ((pIVar18->Windows).Size != 0) {
        auVar35._0_4_ = (float)local_c8._0_4_ - local_b8;
        auVar35._4_4_ = (float)local_c8._4_4_ - fStack_b4;
        auVar35._8_4_ = fStack_c0 - fStack_b0;
        auVar35._12_4_ = fStack_bc - fStack_ac;
        _local_c8 = divps(auVar35,local_f8);
        local_b8 = local_b8 - local_d8.x * local_c8._0_4_;
        fStack_b4 = fStack_b4 - local_d8.y * local_c8._4_4_;
        fStack_b0 = fStack_b0 - (float)uStack_d0 * local_c8._8_4_;
        fStack_ac = fStack_ac - uStack_d0._4_4_ * local_c8._12_4_;
        uVar23 = 0;
        do {
          this = (pIVar18->Windows).Data[uVar23];
          if (((this->WasActive == true) && ((this->Flags & 0x1000000) == 0)) &&
             (this->Viewport == local_80)) {
            local_48 = this->Pos;
            uStack_40 = 0;
            local_d8.y = (this->Size).y + local_48.y;
            local_d8.x = (this->Size).x + local_48.x;
            uStack_d0 = 0;
            local_f8 = ZEXT416((uint)((this->SizeFull).x + local_48.x));
            ImGuiWindow::TitleBarHeight(this);
            fVar33 = (float)(int)(local_48.x * (float)local_c8._0_4_ + local_b8);
            fVar36 = (float)(int)(local_48.y * (float)local_c8._4_4_ + fStack_b4);
            fVar37 = (float)(int)(local_d8.x * (float)local_c8._0_4_ + local_b8);
            fVar40 = (float)(int)(local_d8.y * (float)local_c8._4_4_ + fStack_b4);
            fVar27 = (float)(int)((this->Pos).x * (float)local_c8._0_4_ + local_b8);
            fVar30 = (float)(int)((this->Pos).y * (float)local_c8._4_4_ + fStack_b4);
            fVar34 = (float)(int)((float)local_f8._0_4_ * (float)local_c8._0_4_ + local_b8);
            fVar38 = fVar30 + 5.0;
            fVar29 = local_108.y;
            if ((local_108.y <= fVar36) && (fVar29 = local_100.y, fVar36 <= local_100.y)) {
              fVar29 = fVar36;
            }
            fVar36 = local_100.x;
            if (fVar33 <= local_100.x) {
              fVar36 = fVar33;
            }
            local_128.x = (float)(-(uint)(fVar33 < local_108.x) & (uint)local_108.x |
                                 ~-(uint)(fVar33 < local_108.x) & (uint)fVar36);
            local_128.y = fVar29;
            fVar29 = local_108.y;
            if ((local_108.y <= fVar40) && (fVar29 = local_100.y, fVar40 <= local_100.y)) {
              fVar29 = fVar40;
            }
            fVar33 = local_100.x;
            if (fVar37 <= local_100.x) {
              fVar33 = fVar37;
            }
            IStack_120.x = (float)(-(uint)(fVar37 < local_108.x) & (uint)local_108.x |
                                  ~-(uint)(fVar37 < local_108.x) & (uint)fVar33);
            IStack_120.y = fVar29;
            fVar29 = local_108.y;
            if ((local_108.y <= fVar30) && (fVar29 = local_100.y, fVar30 <= local_100.y)) {
              fVar29 = fVar30;
            }
            fVar30 = local_100.x;
            if (fVar27 <= local_100.x) {
              fVar30 = fVar27;
            }
            local_118.x = (float)(-(uint)(fVar27 < local_108.x) & (uint)local_108.x |
                                 ~-(uint)(fVar27 < local_108.x) & (uint)fVar30);
            local_118.y = fVar29;
            IStack_110.y = local_108.y;
            if ((local_108.y <= fVar38) && (IStack_110.y = local_100.y, fVar38 <= local_100.y)) {
              IStack_110.y = fVar38;
            }
            fVar29 = local_100.x;
            if (fVar34 <= local_100.x) {
              fVar29 = fVar34;
            }
            IStack_110.x = (float)(-(uint)(fVar34 < local_108.x) & (uint)local_108.x |
                                  ~-(uint)(fVar34 < local_108.x) & (uint)fVar29);
            if (pIVar18->NavWindow == (ImGuiWindow *)0x0) {
              uVar24 = 10;
            }
            else {
              uVar24 = this->RootWindowForTitleBarHighlight ==
                       pIVar18->NavWindow->RootWindowForTitleBarHighlight | 10;
            }
            pIVar5 = local_e0->DrawList;
            local_138.x = (GImGui->Style).Colors[2].x;
            local_138.y = (GImGui->Style).Colors[2].y;
            uVar9 = (GImGui->Style).Colors[2].z;
            uVar10 = (GImGui->Style).Colors[2].w;
            local_138.w = (GImGui->Style).Alpha * fVar26 * (float)uVar10;
            local_138.z = (float)uVar9;
            IVar20 = ColorConvertFloat4ToU32(&local_138);
            ImDrawList::AddRectFilled(pIVar5,&local_128,&IStack_120,IVar20,0.0,0xf);
            pIVar19 = local_e0;
            local_f8._0_8_ = local_e0->DrawList;
            puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar24 << 4));
            local_138._0_8_ = *puVar1;
            uVar11 = puVar1[1];
            local_138.w = (float)((ulong)uVar11 >> 0x20);
            local_138.z = (float)uVar11;
            local_138.w = (GImGui->Style).Alpha * fVar26 * local_138.w;
            IVar20 = ColorConvertFloat4ToU32(&local_138);
            ImDrawList::AddRectFilled
                      ((ImDrawList *)local_f8._0_8_,&local_118,&IStack_110,IVar20,0.0,0xf);
            pIVar5 = pIVar19->DrawList;
            local_138.x = (GImGui->Style).Colors[5].x;
            local_138.y = (GImGui->Style).Colors[5].y;
            uVar12 = (GImGui->Style).Colors[5].z;
            uVar13 = (GImGui->Style).Colors[5].w;
            local_138.w = (GImGui->Style).Alpha * fVar26 * (float)uVar13;
            local_138.z = (float)uVar12;
            IVar20 = ColorConvertFloat4ToU32(&local_138);
            ImDrawList::AddRect(pIVar5,&local_128,&IStack_120,IVar20,0.0,0xf,1.0);
            if (this->DockNodeAsHost != (ImGuiDockNode *)0x0) {
              this = this->DockNodeAsHost->VisibleWindow;
            }
            if (this != (ImGuiWindow *)0x0) {
              pIVar5 = local_e0->DrawList;
              font = pIVar18->Font;
              local_f8._0_4_ = pIVar18->FontSize;
              local_138.x = (GImGui->Style).Colors[0].x;
              local_138.y = (GImGui->Style).Colors[0].y;
              uVar14 = (GImGui->Style).Colors[0].z;
              uVar15 = (GImGui->Style).Colors[0].w;
              local_138.w = (GImGui->Style).Alpha * fVar26 * (float)uVar15;
              local_138.z = (float)uVar14;
              IVar20 = ColorConvertFloat4ToU32(&local_138);
              text_begin = this->Name;
              text_end = text_begin;
              if (text_begin != (char *)0xffffffffffffffff) {
                do {
                  if (*text_end == '#') {
                    if (text_end[1] == '#') goto LAB_0016b120;
                  }
                  else if (*text_end == '\0') goto LAB_0016b120;
                  text_end = text_end + 1;
                } while (text_end != (char *)0xffffffffffffffff);
                text_end = (char *)0xffffffffffffffff;
              }
LAB_0016b120:
              ImDrawList::AddText(pIVar5,font,(float)local_f8._0_4_,&local_118,IVar20,text_begin,
                                  text_end,0.0,(ImVec4 *)0x0);
            }
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != (uint)(pIVar18->Windows).Size);
      }
      local_138.x = (GImGui->Style).Colors[5].x;
      local_138.y = (GImGui->Style).Colors[5].y;
      uVar16 = (GImGui->Style).Colors[5].z;
      uVar17 = (GImGui->Style).Colors[5].w;
      local_138.w = fVar26 * (GImGui->Style).Alpha * (float)uVar17;
      local_138.z = (float)uVar16;
      IVar20 = ColorConvertFloat4ToU32(&local_138);
      ImDrawList::AddRect(local_90,&local_108,&local_100,IVar20,0.0,0xf,1.0);
      lVar21 = local_88 + 1;
    } while (lVar21 < (local_98->Viewports).Size);
  }
  local_138.y = ((float)local_68._4_4_ - (float)local_78._4_4_) * 0.125;
  local_138.x = ((float)local_68._0_4_ - (float)local_78._0_4_) * 0.125;
  Dummy((ImVec2 *)&local_138);
  return;
}

Assistant:

void ImGui::ShowViewportThumbnails()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We don't display full monitor bounds (we could, but it often looks awkward), instead we display just enough to cover all of our viewports.
    float SCALE = 1.0f / 8.0f;
    ImRect bb_full;
    //for (int n = 0; n < g.PlatformIO.Monitors.Size; n++)
    //    bb_full.Add(GetPlatformMonitorMainRect(g.PlatformIO.Monitors[n]));
    for (int n = 0; n < g.Viewports.Size; n++)
        bb_full.Add(g.Viewports[n]->GetRect());
    ImVec2 p = window->DC.CursorPos;
    ImVec2 off = p - bb_full.Min * SCALE;
    //for (int n = 0; n < g.PlatformIO.Monitors.Size; n++)
    //    window->DrawList->AddRect(off + g.PlatformIO.Monitors[n].MainPos * SCALE, off + (g.PlatformIO.Monitors[n].MainPos + g.PlatformIO.Monitors[n].MainSize) * SCALE, ImGui::GetColorU32(ImGuiCol_Border));
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        ImRect viewport_draw_bb(off + (viewport->Pos) * SCALE, off + (viewport->Pos + viewport->Size) * SCALE);
        RenderViewportThumbnail(window->DrawList, viewport, viewport_draw_bb);
    }
    ImGui::Dummy(bb_full.GetSize() * SCALE);
}